

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CasesSimp.cpp
# Opt level: O2

VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TermList>_> __thiscall
Inferences::CasesSimp::RewriteableSubtermsFn::operator()(RewriteableSubtermsFn *this,Literal *lit)

{
  int *piVar1;
  BooleanSubtermIt *this_00;
  Term *in_RDX;
  VirtualIterator<Kernel::TermList> VStack_38;
  VirtualIterator<Kernel::TermList> local_30;
  MappingIterator<Lib::VirtualIterator<Kernel::TermList>,_Lib::PairRightPushingFn<Kernel::Literal_*,_Kernel::TermList>,_std::pair<Kernel::Literal_*,_Kernel::TermList>_>
  local_28;
  
  this_00 = (BooleanSubtermIt *)::operator_new(0x38);
  Kernel::BooleanSubtermIt::BooleanSubtermIt(this_00,in_RDX,false);
  piVar1 = &(this_00->super_IteratorCore<Kernel::TermList>)._refCnt;
  *piVar1 = *piVar1 + 1;
  local_30._core = (IteratorCore<Kernel::TermList> *)this_00;
  Lib::getUniquePersistentIterator<Lib::VirtualIterator<Kernel::TermList>>
            ((Lib *)&VStack_38,&local_30);
  Lib::pushPairIntoRightIterator<Kernel::Literal*,Lib::VirtualIterator<Kernel::TermList>>
            ((Lib *)&local_28,(Literal *)in_RDX,&VStack_38);
  Lib::
  pvi<Lib::MappingIterator<Lib::VirtualIterator<Kernel::TermList>,Lib::PairRightPushingFn<Kernel::Literal*,Kernel::TermList>,std::pair<Kernel::Literal*,Kernel::TermList>>>
            ((Lib *)this,&local_28);
  Lib::VirtualIterator<Kernel::TermList>::~VirtualIterator(&local_28._inner);
  Lib::VirtualIterator<Kernel::TermList>::~VirtualIterator(&VStack_38);
  Lib::VirtualIterator<Kernel::TermList>::~VirtualIterator(&local_30);
  return (VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TermList>_>)
         (IteratorCore<std::pair<Kernel::Literal_*,_Kernel::TermList>_> *)this;
}

Assistant:

VirtualIterator<pair<Literal*, TermList> > operator()(Literal* lit)
  {
    return pvi( pushPairIntoRightIterator(lit, 
                getUniquePersistentIterator(vi(new BooleanSubtermIt(lit)))));
  }